

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics_accumulation.cc
# Opt level: O0

bool __thiscall
sptk::StatisticsAccumulation::GetMean
          (StatisticsAccumulation *this,Buffer *buffer,vector<double,_std::allocator<double>_> *mean
          )

{
  size_type sVar1;
  const_iterator __first;
  iterator __last;
  vector<double,_std::allocator<double>_> *in_RDX;
  long in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __result;
  double z;
  anon_class_8_1_54a3981a in_stack_ffffffffffffff90;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffffa8;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffffb0;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffffb8;
  bool local_1;
  
  if ((((((ulong)(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_end_of_storage & 0x10000) == 0) ||
       (*(int *)((long)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_finish + 4) < 1)) || (*(int *)(in_RSI + 8) < 1))
     || (in_RDX == (vector<double,_std::allocator<double>_> *)0x0)) {
    local_1 = false;
  }
  else {
    sVar1 = std::vector<double,_std::allocator<double>_>::size(in_RDX);
    if (sVar1 != (long)(*(int *)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>).
                                 _M_impl.super__Vector_impl_data._M_finish + 1)) {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffffb0._M_current,
                 (size_type)in_stack_ffffffffffffffa8._M_current);
    }
    if (((ulong)(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage & 0x100) == 0) {
      __result._M_current = (double *)(1.0 / (double)*(int *)(in_RSI + 8));
      std::vector<double,_std::allocator<double>_>::begin(in_RDI);
      __first = std::vector<double,_std::allocator<double>_>::end(in_RDI);
      __last = std::vector<double,_std::allocator<double>_>::begin(in_RDI);
      std::
      transform<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,sptk::StatisticsAccumulation::GetMean(sptk::StatisticsAccumulation::Buffer_const&,std::vector<double,std::allocator<double>>*)const::__0>
                ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
                 __first._M_current,
                 (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
                 __last._M_current,__result,in_stack_ffffffffffffff90);
    }
    else {
      std::vector<double,_std::allocator<double>_>::begin(in_RDI);
      std::vector<double,_std::allocator<double>_>::end(in_RDI);
      std::vector<double,_std::allocator<double>_>::begin(in_RDI);
      std::
      copy<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool StatisticsAccumulation::GetMean(
    const StatisticsAccumulation::Buffer& buffer,
    std::vector<double>* mean) const {
  if (!is_valid_ || num_statistics_order_ < 1 ||
      buffer.zeroth_order_statistics_ <= 0 || NULL == mean) {
    return false;
  }

  if (mean->size() != static_cast<std::size_t>(num_order_ + 1)) {
    mean->resize(num_order_ + 1);
  }

  if (numerically_stable_) {
    std::copy(buffer.first_order_statistics_.begin(),
              buffer.first_order_statistics_.end(), mean->begin());
  } else {
    const double z(1.0 / buffer.zeroth_order_statistics_);
    std::transform(buffer.first_order_statistics_.begin(),
                   buffer.first_order_statistics_.end(), mean->begin(),
                   [z](double x) { return z * x; });
  }

  return true;
}